

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

string * __thiscall
iqnet::ssl::ConnectionVerifier::cert_finger_sha256_abi_cxx11_
          (string *__return_storage_ptr__,ConnectionVerifier *this,X509_STORE_CTX *ctx)

{
  X509 *data;
  EVP_MD *type;
  int i;
  long lVar1;
  uint n;
  uchar md [64];
  ostringstream ss;
  uint local_1dc;
  byte local_1d8 [72];
  long local_190 [3];
  uint auStack_178 [88];
  
  data = X509_STORE_CTX_get_current_cert((X509_STORE_CTX *)ctx);
  type = EVP_get_digestbyname("sha256");
  local_1dc = 0;
  X509_digest(data,type,local_1d8,&local_1dc);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
         *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::operator<<((ostringstream *)local_190,(uint)local_1d8[lVar1]);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string
ConnectionVerifier::cert_finger_sha256(X509_STORE_CTX* ctx) const
{
  X509* x = X509_STORE_CTX_get_current_cert(ctx);
  const EVP_MD* digest = EVP_get_digestbyname("sha256");
  unsigned int n = 0;
  unsigned char md[EVP_MAX_MD_SIZE];
  X509_digest(x, digest, md, &n);

  std::ostringstream ss;
  for(int i = 0; i < 32; i++)
     ss << std::hex << int(md[i]);

  return ss.str();
}